

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_char_array(coda_cursor *cursor,char *dst,coda_array_ordering array_ordering)

{
  coda_backend cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *message;
  coda_type *type;
  coda_native_type read_type;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (type = (coda_type *)cursor->stack[cursor->n - 1].type, type == (coda_type *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x1028;
LAB_00127d8e:
    coda_set_error(-100,pcVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar4);
    goto LAB_00127d95;
  }
  if (dst == (char *)0x0) {
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0x102d;
    goto LAB_00127d8e;
  }
  cVar1 = type->format;
  if (99 < cVar1) {
    type = *(coda_type **)&type->type_class;
  }
  if (type->type_class != coda_array_class) {
    pcVar3 = coda_type_get_class_name(type->type_class);
    message = "cursor does not refer to an array (current type is %s)";
LAB_00127dd9:
    coda_set_error(-0x69,message,pcVar3);
    goto LAB_00127d95;
  }
  get_array_element_read_type(type,&read_type);
  if (read_type != coda_native_type_char) {
    pcVar3 = coda_type_get_native_type_name(read_type);
    message = "can not read %s data using a char data type";
    goto LAB_00127dd9;
  }
  switch(cVar1) {
  case coda_backend_memory:
    iVar2 = coda_mem_cursor_read_char_array(cursor,dst,array_ordering);
    goto LAB_00127e54;
  case coda_backend_hdf4:
    coda_set_error(-0xb,(char *)0x0);
    goto LAB_00127d95;
  case coda_backend_hdf5:
  case coda_backend_grib:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                  ,0x544,"int read_char_array(const coda_cursor *, char *, coda_array_ordering)");
  case coda_backend_cdf:
    iVar2 = coda_cdf_cursor_read_char_array(cursor,dst);
    break;
  case coda_backend_netcdf:
    iVar2 = coda_netcdf_cursor_read_char_array(cursor,dst);
    break;
  default:
    if (cVar1 == coda_backend_binary) {
      iVar2 = coda_bin_cursor_read_char_array(cursor,dst,array_ordering);
      goto LAB_00127e54;
    }
    if (cVar1 == coda_backend_ascii) {
      iVar2 = coda_ascii_cursor_read_char_array(cursor,dst,array_ordering);
      goto LAB_00127e54;
    }
    goto LAB_00127e42;
  }
  if (iVar2 == 0) {
LAB_00127e42:
    if (array_ordering != coda_array_ordering_c) {
      iVar2 = transpose_array(cursor,dst,1);
LAB_00127e54:
      if (iVar2 != 0) goto LAB_00127d95;
    }
    iVar2 = 0;
  }
  else {
LAB_00127d95:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

LIBCODA_API int coda_cursor_read_char_array(const coda_cursor *cursor, char *dst, coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_char:
            if (read_char_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a char data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}